

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void aom_highbd_var_filter_block2d_bil_second_pass
               (uint16_t *src_ptr,uint16_t *output_ptr,uint src_pixels_per_line,uint pixel_step,
               uint output_height,uint output_width,uint8_t *filter)

{
  uint j;
  uint i;
  uint output_width_local;
  uint output_height_local;
  uint pixel_step_local;
  uint src_pixels_per_line_local;
  uint16_t *output_ptr_local;
  uint16_t *src_ptr_local;
  
  output_ptr_local = output_ptr;
  src_ptr_local = src_ptr;
  for (i = 0; i < output_height; i = i + 1) {
    for (j = 0; j < output_width; j = j + 1) {
      output_ptr_local[j] =
           (uint16_t)
           ((int)((uint)*src_ptr_local * (uint)*filter +
                  (uint)src_ptr_local[pixel_step] * (uint)filter[1] + 0x40) >> 7);
      src_ptr_local = src_ptr_local + 1;
    }
    src_ptr_local = src_ptr_local + (src_pixels_per_line - output_width);
    output_ptr_local = output_ptr_local + output_width;
  }
  return;
}

Assistant:

void aom_highbd_var_filter_block2d_bil_second_pass(
    const uint16_t *src_ptr, uint16_t *output_ptr,
    unsigned int src_pixels_per_line, unsigned int pixel_step,
    unsigned int output_height, unsigned int output_width,
    const uint8_t *filter) {
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; ++j) {
      output_ptr[j] = ROUND_POWER_OF_TWO(
          (int)src_ptr[0] * filter[0] + (int)src_ptr[pixel_step] * filter[1],
          FILTER_BITS);
      ++src_ptr;
    }

    src_ptr += src_pixels_per_line - output_width;
    output_ptr += output_width;
  }
}